

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseElementDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  elementDeclSAXFunc p_Var2;
  int iVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  xmlParserErrors code;
  xmlChar *pxVar6;
  xmlChar xVar7;
  xmlElementContentPtr cur;
  xmlDocPtr doc;
  xmlElementContentPtr content;
  char *pcVar8;
  xmlElementContentPtr local_30;
  
  local_30 = (xmlElementContentPtr)0x0;
  pxVar4 = ctxt->input;
  pxVar5 = pxVar4->cur;
  if (*pxVar5 != '<') {
    return -1;
  }
  if (pxVar5[1] != '!') {
    return -1;
  }
  pxVar6 = pxVar5 + 2;
  pxVar4->cur = pxVar6;
  pxVar4->col = pxVar4->col + 2;
  xVar7 = pxVar5[2];
  if (xVar7 == '\0') {
    xmlParserGrow(ctxt);
    pxVar4 = ctxt->input;
    pxVar6 = pxVar4->cur;
    xVar7 = *pxVar6;
  }
  if (xVar7 != 'E') {
    return -1;
  }
  if (pxVar6[1] != 'L') {
    return -1;
  }
  if (pxVar6[2] != 'E') {
    return -1;
  }
  if (pxVar6[3] != 'M') {
    return -1;
  }
  if (pxVar6[4] != 'E') {
    return -1;
  }
  if (pxVar6[5] != 'N') {
    return -1;
  }
  if (pxVar6[6] != 'T') {
    return -1;
  }
  iVar1 = pxVar4->id;
  pxVar4->cur = pxVar6 + 7;
  pxVar4->col = pxVar4->col + 7;
  if (pxVar6[7] == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar3 = xmlSkipBlankCharsPE(ctxt);
  if (iVar3 == 0) {
    pcVar8 = "Space required after \'ELEMENT\'\n";
    code = XML_ERR_SPACE_REQUIRED;
    goto LAB_0013a4ec;
  }
  pxVar5 = xmlParseName(ctxt);
  if (pxVar5 == (xmlChar *)0x0) {
    pcVar8 = "xmlParseElementDecl: no name for Element\n";
    code = XML_ERR_NAME_REQUIRED;
    goto LAB_0013a4ec;
  }
  iVar3 = xmlSkipBlankCharsPE(ctxt);
  if (iVar3 == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Space required after the element name\n");
  }
  pxVar4 = ctxt->input;
  pxVar6 = pxVar4->cur;
  xVar7 = *pxVar6;
  if (xVar7 == '(') {
    iVar3 = xmlParseElementContentDecl(ctxt,pxVar5,&local_30);
  }
  else {
    if (xVar7 == 'A') {
      if ((pxVar6[1] != 'N') || (pxVar6[2] != 'Y')) goto LAB_0013a4b6;
      pxVar4->cur = pxVar6 + 3;
      pxVar4->col = pxVar4->col + 3;
      iVar3 = 2;
      xVar7 = pxVar6[3];
    }
    else {
      if ((((xVar7 != 'E') || (pxVar6[1] != 'M')) || (pxVar6[2] != 'P')) ||
         ((pxVar6[3] != 'T' || (pxVar6[4] != 'Y')))) {
LAB_0013a4b6:
        pcVar8 = "xmlParseElementDecl: \'EMPTY\', \'ANY\' or \'(\' expected\n";
        code = XML_ERR_ELEMCONTENT_NOT_STARTED;
LAB_0013a4ec:
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                   (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar8);
        return -1;
      }
      pxVar4->cur = pxVar6 + 5;
      pxVar4->col = pxVar4->col + 5;
      iVar3 = 1;
      xVar7 = pxVar6[5];
    }
    if (xVar7 == '\0') {
      xmlParserGrow(ctxt);
    }
  }
  xmlSkipBlankCharsPE(ctxt);
  if (*ctxt->input->cur == '>') {
    if (iVar1 != ctxt->input->id) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Element declaration doesn\'t start and stop in the same entity\n");
    }
    xmlNextChar(ctxt);
    cur = local_30;
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var2 = ctxt->sax->elementDecl, p_Var2 != (elementDeclSAXFunc)0x0)) {
      if (local_30 == (xmlElementContentPtr)0x0) {
        (*p_Var2)(ctxt->userData,pxVar5,iVar3,(xmlElementContentPtr)0x0);
        return iVar3;
      }
      local_30->parent = (_xmlElementContent *)0x0;
      (*p_Var2)(ctxt->userData,pxVar5,iVar3,local_30);
      if (cur->parent != (_xmlElementContent *)0x0) {
        return iVar3;
      }
      doc = ctxt->myDoc;
      goto LAB_0013a5fb;
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
  }
  if (local_30 == (xmlElementContentPtr)0x0) {
    return iVar3;
  }
  doc = ctxt->myDoc;
  cur = local_30;
LAB_0013a5fb:
  xmlFreeDocElementContent(doc,cur);
  return iVar3;
}

Assistant:

int
xmlParseElementDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    int ret = -1;
    xmlElementContentPtr content  = NULL;

    if ((CUR != '<') || (NXT(1) != '!'))
        return(ret);
    SKIP(2);

    /* GROW; done in the caller */
    if (CMP7(CUR_PTR, 'E', 'L', 'E', 'M', 'E', 'N', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(7);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space required after 'ELEMENT'\n");
	    return(-1);
	}
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "xmlParseElementDecl: no name for Element\n");
	    return(-1);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the element name\n");
	}
	if (CMP5(CUR_PTR, 'E', 'M', 'P', 'T', 'Y')) {
	    SKIP(5);
	    /*
	     * Element must always be empty.
	     */
	    ret = XML_ELEMENT_TYPE_EMPTY;
	} else if ((RAW == 'A') && (NXT(1) == 'N') &&
	           (NXT(2) == 'Y')) {
	    SKIP(3);
	    /*
	     * Element is a generic container.
	     */
	    ret = XML_ELEMENT_TYPE_ANY;
	} else if (RAW == '(') {
	    ret = xmlParseElementContentDecl(ctxt, name, &content);
	} else {
	    /*
	     * [ WFC: PEs in Internal Subset ] error handling.
	     */
            xmlFatalErrMsg(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
                  "xmlParseElementDecl: 'EMPTY', 'ANY' or '(' expected\n");
	    return(-1);
	}

	SKIP_BLANKS_PE;

	if (RAW != '>') {
	    xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
	    if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element declaration doesn't start and stop in"
                               " the same entity\n");
	    }

	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->elementDecl != NULL)) {
		if (content != NULL)
		    content->parent = NULL;
	        ctxt->sax->elementDecl(ctxt->userData, name, ret,
		                       content);
		if ((content != NULL) && (content->parent == NULL)) {
		    /*
		     * this is a trick: if xmlAddElementDecl is called,
		     * instead of copying the full tree it is plugged directly
		     * if called from the parser. Avoid duplicating the
		     * interfaces or change the API/ABI
		     */
		    xmlFreeDocElementContent(ctxt->myDoc, content);
		}
	    } else if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	}
    }
    return(ret);
}